

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::AddToHash(AActor *this)

{
  AActor **ppAVar1;
  AActor *pAVar2;
  
  if (this->tid != 0) {
    ppAVar1 = TIDHash + (this->tid & 0x7f);
    pAVar2 = *ppAVar1;
    this->inext = pAVar2;
    this->iprev = ppAVar1;
    *ppAVar1 = this;
    if (pAVar2 != (AActor *)0x0) {
      pAVar2->iprev = &this->inext;
    }
    return;
  }
  this->inext = (AActor *)0x0;
  this->iprev = (AActor **)0x0;
  return;
}

Assistant:

void AActor::AddToHash ()
{
	if (tid == 0)
	{
		iprev = NULL;
		inext = NULL;
		return;
	}
	else
	{
		int hash = TIDHASH (tid);

		inext = TIDHash[hash];
		iprev = &TIDHash[hash];
		TIDHash[hash] = this;
		if (inext)
		{
			inext->iprev = &inext;
		}
	}
}